

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
yy::parser::basic_symbol<yy::parser::by_state>::move
          (basic_symbol<yy::parser::by_state> *this,basic_symbol<yy::parser::by_state> *s)

{
  counter_type cVar1;
  symbol_kind_type sVar2;
  basic_symbol<yy::parser::by_state> *s_local;
  basic_symbol<yy::parser::by_state> *this_local;
  
  by_state::move(&this->super_by_state,&s->super_by_state);
  sVar2 = by_state::kind(&this->super_by_state);
  if ((sVar2 != S_IDENTIFIER) && (sVar2 != S_BRACKET_ARGUMENT)) {
    if (sVar2 == S_REF_OPEN) {
      value_type::move<ReferenceType>(&this->value,&s->value);
      goto LAB_0010d0a3;
    }
    if (2 < (uint)(sVar2 + ~S_REF_CLOSE)) {
      if (((((uint)(sVar2 + ~S_29_3) < 3) || ((uint)(sVar2 + ~S_argument) < 2)) ||
          (sVar2 == S_unquoted_argument)) || ((uint)(sVar2 + ~S_unquoted_element) < 2)) {
        value_type::move<unsigned_long>(&this->value,&s->value);
      }
      goto LAB_0010d0a3;
    }
  }
  value_type::move<std::__cxx11::string>(&this->value,&s->value);
LAB_0010d0a3:
  (this->location).begin.filename = (s->location).begin.filename;
  cVar1 = (s->location).begin.column;
  (this->location).begin.line = (s->location).begin.line;
  (this->location).begin.column = cVar1;
  (this->location).end.filename = (s->location).end.filename;
  cVar1 = (s->location).end.column;
  (this->location).end.line = (s->location).end.line;
  (this->location).end.column = cVar1;
  return;
}

Assistant:

void
  parser::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.move< ReferenceType > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.move< std::size_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.move< std::string > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }